

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *in_RCX;
  int family;
  int sock;
  int family_00;
  int sock_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar2;
  undefined8 extraout_RDX_05;
  long lVar3;
  int iVar4;
  nn_thread threads [100];
  
  signal(0xd,(__sighandler_t)0x1);
  iVar1 = test_socket_impl((char *)0x56,0x20,family,(int)in_RCX);
  test_bind_impl((char *)0x57,iVar1,sock,in_RCX);
  uVar2 = extraout_RDX;
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0x960; lVar3 = lVar3 + 0x18) {
      nn_thread_init((nn_thread *)((long)&threads[0].routine + lVar3),routine,(void *)0x0);
      uVar2 = extraout_RDX_00;
    }
    for (lVar3 = 0; lVar3 != 0x960; lVar3 = lVar3 + 0x18) {
      nn_thread_term((nn_thread *)((long)&threads[0].routine + lVar3));
      uVar2 = extraout_RDX_01;
    }
  }
  test_close_impl((char *)0x60,iVar1,(int)uVar2);
  iVar1 = test_socket_impl((char *)0x64,0x50,family_00,(int)in_RCX);
  test_bind_impl((char *)0x65,iVar1,sock_00,in_RCX);
  uVar2 = extraout_RDX_02;
  for (iVar4 = 0; iVar4 != 10; iVar4 = iVar4 + 1) {
    for (lVar3 = 0; lVar3 != 0xf0; lVar3 = lVar3 + 0x18) {
      nn_thread_init((nn_thread *)((long)&threads[0].routine + lVar3),routine2,(void *)0x0);
      uVar2 = extraout_RDX_03;
    }
    active = 10;
    while (active != 0) {
      nn_send(iVar1,"hello",5,1);
      uVar2 = extraout_RDX_04;
    }
    for (lVar3 = 0; lVar3 != 0xf0; lVar3 = lVar3 + 0x18) {
      nn_thread_term((nn_thread *)((long)&threads[0].routine + lVar3));
      uVar2 = extraout_RDX_05;
    }
  }
  test_close_impl((char *)0x74,iVar1,(int)uVar2);
  return 0;
}

Assistant:

int main ()
{
    int sb;
    int i;
    int j;
    struct nn_thread threads [THREAD_COUNT];

    /*  Stress the shutdown algorithm. */

#if defined(SIGPIPE) && defined(SIG_IGN)
	signal (SIGPIPE, SIG_IGN);
#endif

    sb = test_socket (AF_SP, NN_PUB);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine, NULL);
        for (i = 0; i != THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    /*  Test race condition of sending message while socket shutting down  */

    sb = test_socket (AF_SP, NN_PUSH);
    test_bind (sb, SOCKET_ADDRESS);

    for (j = 0; j != TEST_LOOPS; ++j) {
        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_init (&threads [i], routine2, NULL);
        active = TEST2_THREAD_COUNT;

        while (active) {
            (void) nn_send (sb, "hello", 5, NN_DONTWAIT);
        }

        for (i = 0; i != TEST2_THREAD_COUNT; ++i)
            nn_thread_term (&threads [i]);
    }

    test_close (sb);

    return 0;
}